

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O3

int gost_mgm128_decrypt(mgm128_context *ctx,uchar *in,uchar *out,size_t len)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  block128_f p_Var6;
  mul128_f p_Var7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  size_t counter_bytes;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  
  uVar4 = (ctx->len).u[0];
  uVar5 = (ctx->len).u[1];
  p_Var6 = ctx->block;
  p_Var7 = ctx->mul_gf;
  pvVar8 = ctx->key;
  uVar2 = ctx->blocklen;
  if (uVar5 == 0) {
    (ctx->nonce).c[0] = (ctx->nonce).c[0] & 0x7f;
    (*p_Var6)((uchar *)ctx,(uchar *)&ctx->Yi,pvVar8);
  }
  uVar15 = 1L << ((char)uVar2 * '\x04' - 3U & 0x3f);
  uVar17 = uVar5 + len;
  if (((CARRY8(uVar5,len)) || (uVar15 < uVar17)) || (uVar15 < uVar17 + uVar4)) {
    ERR_GOST_error(0xab,0x8d,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x18d);
    iVar14 = -1;
  }
  else {
    (ctx->len).u[1] = uVar17;
    uVar16 = ctx->mres;
    uVar3 = ctx->ares;
    if ((ulong)uVar3 != 0) {
      memset((void *)((long)&ctx->ACi + (ulong)uVar3),0,(ulong)(uVar2 - uVar3));
      (*p_Var6)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar8);
      (*p_Var7)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
      uVar3 = (ctx->mul).d[1];
      uVar9 = (ctx->mul).d[2];
      uVar10 = (ctx->mul).d[3];
      uVar11 = (ctx->sum).d[1];
      uVar12 = (ctx->sum).d[2];
      uVar13 = (ctx->sum).d[3];
      (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
      (ctx->sum).d[1] = uVar11 ^ uVar3;
      (ctx->sum).d[2] = uVar12 ^ uVar9;
      (ctx->sum).d[3] = uVar13 ^ uVar10;
      inc_counter((uchar *)(ctx->Zi).u,(long)((int)uVar2 / 2));
      ctx->ares = 0;
    }
    if (len != 0) {
      uVar16 = uVar16 % uVar2;
      counter_bytes = (size_t)((int)uVar2 / 2);
      sVar18 = 0;
      do {
        if (uVar16 == 0) {
          (*p_Var6)((uchar *)&ctx->Yi,(uchar *)&ctx->EKi,pvVar8);
          inc_counter((ctx->Yi).c + counter_bytes,counter_bytes);
        }
        bVar1 = in[sVar18];
        (ctx->ACi).c[uVar16] = bVar1;
        out[sVar18] = bVar1 ^ (ctx->EKi).c[uVar16];
        uVar16 = uVar16 + 1;
        if (uVar16 == uVar2) {
          uVar16 = 0;
        }
        if (uVar16 == 0) {
          (*p_Var6)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar8);
          (*p_Var7)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
          uVar3 = (ctx->mul).d[1];
          uVar9 = (ctx->mul).d[2];
          uVar10 = (ctx->mul).d[3];
          uVar11 = (ctx->sum).d[1];
          uVar12 = (ctx->sum).d[2];
          uVar13 = (ctx->sum).d[3];
          (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
          (ctx->sum).d[1] = uVar11 ^ uVar3;
          (ctx->sum).d[2] = uVar12 ^ uVar9;
          (ctx->sum).d[3] = uVar13 ^ uVar10;
          inc_counter((uchar *)(ctx->Zi).u,counter_bytes);
        }
        sVar18 = sVar18 + 1;
      } while (len != sVar18);
    }
    ctx->mres = uVar16;
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int gost_mgm128_decrypt(mgm128_context *ctx, const unsigned char *in,
                          unsigned char *out, size_t len)
{
    size_t i;
    unsigned int n, mres;
    uint64_t alen = ctx->len.u[0];
    uint64_t mlen = ctx->len.u[1];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (mlen == 0) {
        ctx->nonce.c[0] &= 0x7f;
        (*block) (ctx->nonce.c, ctx->Yi.c, key);  // Y_1 = E_K(0 || nonce)
    }

    mlen += len;
    if (mlen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||     // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && mlen < len) ||
        (mlen + alen) > ((ossl_uintmax_t)(1) << (bl * 4 - 3))) {
            GOSTerr(GOST_F_GOST_MGM128_DECRYPT,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[1] = mlen;

    mres = ctx->mres;

    if (ctx->ares) {
        /* First call to encrypt finalizes AAD */
        memset(ctx->ACi.c + ctx->ares, 0, bl - ctx->ares);
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)

        ctx->ares = 0;
    }

    n = mres % bl;
    // TODO: replace with full blocks processing
    for (i = 0; i < len; ++i) {
        uint8_t c;
        if (n == 0) {
            (*block) (ctx->Yi.c, ctx->EKi.c, key);      // E_K(Y_i)
            inc_counter(ctx->Yi.c + bl / 2, bl / 2);    // Y_i = incr_r(Y_{i-1})
        }
        ctx->ACi.c[n] = c = in[i];
        out[i] = c ^ ctx->EKi.c[n];             // P_i = C_i (xor) E_K(Y_i)
        mres = n = (n + 1) % bl;
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) C_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
                (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)
        }
    }

    ctx->mres = mres;
    return 0;
}